

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

void __thiscall xmrig::Client::startTimeout(Client *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  this->m_expire = 0;
  uVar1 = (this->super_BaseClient).m_pool.m_keepAlive;
  if ((byte)(0 < (int)uVar1 | ((byte)(this->m_extensions).super__Base_bitset<1UL>._M_w & 4) >> 2) ==
      1) {
    lVar3 = 60000;
    if (0 < (int)uVar1) {
      lVar3 = (ulong)uVar1 * 1000;
    }
    lVar2 = std::chrono::_V2::steady_clock::now();
    this->m_keepAlive = lVar2 / 1000000 + lVar3;
  }
  return;
}

Assistant:

void xmrig::Client::startTimeout()
{
    m_expire = 0;

    if (has<EXT_KEEPALIVE>()) {
        const uint64_t ms = static_cast<uint64_t>(m_pool.keepAlive() > 0 ? m_pool.keepAlive() : Pool::kKeepAliveTimeout) * 1000;

        m_keepAlive = Chrono::steadyMSecs() + ms;
    }
}